

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusinputcontextproxy.h
# Opt level: O2

QDBusPendingReply<> * __thiscall
QIBusInputContextProxy::Reset
          (QDBusPendingReply<> *__return_storage_ptr__,QIBusInputContextProxy *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QDBusPendingCall local_50 [8];
  QArrayDataPointer<QVariant> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (QVariant *)0x0;
  local_48.size = 0;
  local_68.d = (Data *)0x0;
  local_80.d = (Data *)0x0;
  local_80.ptr = (char16_t *)0x0;
  local_68.ptr = L"Reset";
  local_80.size = 0;
  local_68.size = 5;
  QDBusAbstractInterface::asyncCallWithArgumentList((QString *)local_50,(QList *)this);
  QDBusPendingReply<>::QDBusPendingReply(__return_storage_ptr__,local_50);
  QDBusPendingCall::~QDBusPendingCall(local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusPendingReply<> Reset()
    {
        QList<QVariant> argumentList;
        return asyncCallWithArgumentList(QStringLiteral("Reset"), argumentList);
    }